

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error __thiscall txq::mode(txq *this,context *ctx,token *token,opcode *op)

{
  undefined8 this_00;
  bool bVar1;
  unsigned_long *puVar2;
  optional<unsigned_long> oVar3;
  token local_70;
  string_view local_48;
  _Storage<unsigned_long,_true> local_38;
  optional<unsigned_long> result;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = op;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"");
  oVar3 = find_in_table(token,mode::modes,local_48);
  local_38._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_38);
  this_00 = result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._8_8_;
  if (bVar1) {
    puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_38);
    opcode::add_bits((opcode *)this_00,*puVar2 << 0x16);
    context::tokenize(&local_70,ctx);
    memcpy(token,&local_70,0x24);
    memset(this,0,8);
    error::error((error *)this);
  }
  else {
    fail((token *)this,(char *)token,"invalid mode");
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(mode)
    {
        static const char* modes[]{
            "",
            "TEX_HEADER_DIMENSION",
            "TEX_HEADER_TEXTURE_TYPE",
            "",
            "",
            "TEX_HEADER_SAMPLER_POS",
            nullptr,
        };
        const std::optional<uint64_t> result = find_in_table(token, modes, "");
        if (!result) {
            return fail(token, "invalid mode");
        }
        op.add_bits(*result << 22);

        token = ctx.tokenize();
        return {};
    }